

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O0

void utrie_fold(UNewTrie *trie,UNewTrieGetFoldedValue *getFoldedValue,UErrorCode *pErrorCode)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  UBool UVar16;
  uint uVar17;
  int32_t iVar18;
  uint32_t value_00;
  uint32_t uVar19;
  int32_t *piVar20;
  int32_t *piVar21;
  int local_c0;
  int local_bc;
  int32_t block;
  int32_t indexLength;
  UChar32 c;
  uint32_t value;
  int32_t *idx;
  int32_t leadIndexes [32];
  UErrorCode *pErrorCode_local;
  UNewTrieGetFoldedValue *getFoldedValue_local;
  UNewTrie *trie_local;
  
  memcpy(&idx,trie->index + 0x6c0,0x80);
  if (trie->leadUnitValue == *trie->data) {
    local_c0 = 0;
  }
  else {
    iVar18 = utrie_allocDataBlock(trie);
    if (iVar18 < 0) {
      *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
      return;
    }
    utrie_fillBlock(trie->data + iVar18,0,0x20,trie->leadUnitValue,*trie->data,'\x01');
    local_c0 = -iVar18;
  }
  for (block = 0x6c0; block < 0x6e0; block = block + 1) {
    trie->index[block] = local_c0;
  }
  local_bc = 0x800;
  block = 0x10000;
  do {
    while( true ) {
      if (0x10ffff < block) {
        if (local_bc < 0x8800) {
          memmove(trie->index + 0x820,trie->index + 0x800,(long)((local_bc + -0x800) * 4));
          memcpy(trie->index + 0x800,&idx,0x80);
          trie->indexLength = local_bc + 0x20;
        }
        else {
          *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        }
        return;
      }
      if (trie->index[block >> 5] != 0) break;
      block = block + 0x20;
    }
    uVar17 = block & 0xfffffc00;
    iVar18 = _findSameIndexBlock(trie->index,local_bc,(int)uVar17 >> 5);
    value_00 = (*getFoldedValue)(trie,uVar17,iVar18 + 0x20);
    uVar19 = utrie_get32_63(trie,(block >> 10) + 0xd7c0U & 0xffff,(UBool *)0x0);
    if (value_00 != uVar19) {
      UVar16 = utrie_set32_63(trie,(block >> 10) + 0xd7c0U & 0xffff,value_00);
      if (UVar16 == '\0') {
        *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
        return;
      }
      if (iVar18 == local_bc) {
        piVar20 = trie->index + local_bc;
        piVar21 = trie->index + ((int)uVar17 >> 5);
        uVar1 = *(undefined8 *)piVar21;
        uVar2 = *(undefined8 *)(piVar21 + 2);
        uVar3 = *(undefined8 *)(piVar21 + 4);
        uVar4 = *(undefined8 *)(piVar21 + 6);
        uVar5 = *(undefined8 *)(piVar21 + 8);
        uVar6 = *(undefined8 *)(piVar21 + 10);
        uVar7 = *(undefined8 *)(piVar21 + 0xc);
        uVar8 = *(undefined8 *)(piVar21 + 0xe);
        uVar9 = *(undefined8 *)(piVar21 + 0x10);
        uVar10 = *(undefined8 *)(piVar21 + 0x12);
        uVar11 = *(undefined8 *)(piVar21 + 0x14);
        uVar12 = *(undefined8 *)(piVar21 + 0x16);
        uVar13 = *(undefined8 *)(piVar21 + 0x18);
        uVar14 = *(undefined8 *)(piVar21 + 0x1a);
        uVar15 = *(undefined8 *)(piVar21 + 0x1e);
        *(undefined8 *)(piVar20 + 0x1c) = *(undefined8 *)(piVar21 + 0x1c);
        *(undefined8 *)(piVar20 + 0x1e) = uVar15;
        *(undefined8 *)(piVar20 + 0x18) = uVar13;
        *(undefined8 *)(piVar20 + 0x1a) = uVar14;
        *(undefined8 *)(piVar20 + 0x14) = uVar11;
        *(undefined8 *)(piVar20 + 0x16) = uVar12;
        *(undefined8 *)(piVar20 + 0x10) = uVar9;
        *(undefined8 *)(piVar20 + 0x12) = uVar10;
        *(undefined8 *)(piVar20 + 0xc) = uVar7;
        *(undefined8 *)(piVar20 + 0xe) = uVar8;
        *(undefined8 *)(piVar20 + 8) = uVar5;
        *(undefined8 *)(piVar20 + 10) = uVar6;
        *(undefined8 *)(piVar20 + 4) = uVar3;
        *(undefined8 *)(piVar20 + 6) = uVar4;
        *(undefined8 *)piVar20 = uVar1;
        *(undefined8 *)(piVar20 + 2) = uVar2;
        local_bc = local_bc + 0x20;
      }
    }
    block = uVar17 + 0x400;
  } while( true );
}

Assistant:

static void
utrie_fold(UNewTrie *trie, UNewTrieGetFoldedValue *getFoldedValue, UErrorCode *pErrorCode) {
    int32_t leadIndexes[UTRIE_SURROGATE_BLOCK_COUNT];
    int32_t *idx;
    uint32_t value;
    UChar32 c;
    int32_t indexLength, block;
#ifdef UTRIE_DEBUG
    int countLeadCUWithData=0;
#endif

    idx=trie->index;

    /* copy the lead surrogate indexes into a temporary array */
    uprv_memcpy(leadIndexes, idx+(0xd800>>UTRIE_SHIFT), 4*UTRIE_SURROGATE_BLOCK_COUNT);

    /*
     * set all values for lead surrogate code *units* to leadUnitValue
     * so that, by default, runtime lookups will find no data for associated
     * supplementary code points, unless there is data for such code points
     * which will result in a non-zero folding value below that is set for
     * the respective lead units
     *
     * the above saved the indexes for surrogate code *points*
     * fill the indexes with simplified code from utrie_setRange32()
     */
    if(trie->leadUnitValue==trie->data[0]) {
        block=0; /* leadUnitValue==initialValue, use all-initial-value block */
    } else {
        /* create and fill the repeatBlock */
        block=utrie_allocDataBlock(trie);
        if(block<0) {
            /* data table overflow */
            *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        utrie_fillBlock(trie->data+block, 0, UTRIE_DATA_BLOCK_LENGTH, trie->leadUnitValue, trie->data[0], TRUE);
        block=-block; /* negative block number to indicate that it is a repeat block */
    }
    for(c=(0xd800>>UTRIE_SHIFT); c<(0xdc00>>UTRIE_SHIFT); ++c) {
        trie->index[c]=block;
    }

    /*
     * Fold significant index values into the area just after the BMP indexes.
     * In case the first lead surrogate has significant data,
     * its index block must be used first (in which case the folding is a no-op).
     * Later all folded index blocks are moved up one to insert the copied
     * lead surrogate indexes.
     */
    indexLength=UTRIE_BMP_INDEX_LENGTH;

    /* search for any index (stage 1) entries for supplementary code points */
    for(c=0x10000; c<0x110000;) {
        if(idx[c>>UTRIE_SHIFT]!=0) {
            /* there is data, treat the full block for a lead surrogate */
            c&=~0x3ff;

#ifdef UTRIE_DEBUG
            ++countLeadCUWithData;
            /* printf("supplementary data for lead surrogate U+%04lx\n", (long)(0xd7c0+(c>>10))); */
#endif

            /* is there an identical index block? */
            block=_findSameIndexBlock(idx, indexLength, c>>UTRIE_SHIFT);

            /*
             * get a folded value for [c..c+0x400[ and,
             * if different from the value for the lead surrogate code point,
             * set it for the lead surrogate code unit
             */
            value=getFoldedValue(trie, c, block+UTRIE_SURROGATE_BLOCK_COUNT);
            if(value!=utrie_get32(trie, U16_LEAD(c), NULL)) {
                if(!utrie_set32(trie, U16_LEAD(c), value)) {
                    /* data table overflow */
                    *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
                    return;
                }

                /* if we did not find an identical index block... */
                if(block==indexLength) {
                    /* move the actual index (stage 1) entries from the supplementary position to the new one */
                    uprv_memmove(idx+indexLength,
                                 idx+(c>>UTRIE_SHIFT),
                                 4*UTRIE_SURROGATE_BLOCK_COUNT);
                    indexLength+=UTRIE_SURROGATE_BLOCK_COUNT;
                }
            }
            c+=0x400;
        } else {
            c+=UTRIE_DATA_BLOCK_LENGTH;
        }
    }
#ifdef UTRIE_DEBUG
    if(countLeadCUWithData>0) {
        printf("supplementary data for %d lead surrogates\n", countLeadCUWithData);
    }
#endif

    /*
     * index array overflow?
     * This is to guarantee that a folding offset is of the form
     * UTRIE_BMP_INDEX_LENGTH+n*UTRIE_SURROGATE_BLOCK_COUNT with n=0..1023.
     * If the index is too large, then n>=1024 and more than 10 bits are necessary.
     *
     * In fact, it can only ever become n==1024 with completely unfoldable data and
     * the additional block of duplicated values for lead surrogates.
     */
    if(indexLength>=UTRIE_MAX_INDEX_LENGTH) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return;
    }

    /*
     * make space for the lead surrogate index block and
     * insert it between the BMP indexes and the folded ones
     */
    uprv_memmove(idx+UTRIE_BMP_INDEX_LENGTH+UTRIE_SURROGATE_BLOCK_COUNT,
                 idx+UTRIE_BMP_INDEX_LENGTH,
                 4*(indexLength-UTRIE_BMP_INDEX_LENGTH));
    uprv_memcpy(idx+UTRIE_BMP_INDEX_LENGTH,
                leadIndexes,
                4*UTRIE_SURROGATE_BLOCK_COUNT);
    indexLength+=UTRIE_SURROGATE_BLOCK_COUNT;

#ifdef UTRIE_DEBUG
    printf("trie index count: BMP %ld  all Unicode %ld  folded %ld\n",
           UTRIE_BMP_INDEX_LENGTH, (long)UTRIE_MAX_INDEX_LENGTH, indexLength);
#endif

    trie->indexLength=indexLength;
}